

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

Option * __thiscall CLI::App::set_help_flag(App *this,string *name,string *description)

{
  ulong uVar1;
  Option *pOVar2;
  string local_60;
  string local_40;
  string *local_20;
  string *description_local;
  string *name_local;
  App *this_local;
  
  local_20 = description;
  description_local = name;
  name_local = (string *)this;
  if (this->help_ptr_ != (Option *)0x0) {
    remove_option(this,this->help_ptr_);
    this->help_ptr_ = (Option *)0x0;
  }
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ::std::__cxx11::string::string((string *)&local_40,(string *)name);
    ::std::__cxx11::string::string((string *)&local_60,(string *)description);
    pOVar2 = add_flag(this,&local_40,&local_60);
    this->help_ptr_ = pOVar2;
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::__cxx11::string::~string((string *)&local_40);
    OptionBase<CLI::Option>::configurable(&this->help_ptr_->super_OptionBase<CLI::Option>,false);
  }
  return this->help_ptr_;
}

Assistant:

Option *set_help_flag(std::string name = "", std::string description = "") {
        if(help_ptr_ != nullptr) {
            remove_option(help_ptr_);
            help_ptr_ = nullptr;
        }

        // Empty name will simply remove the help flag
        if(!name.empty()) {
            help_ptr_ = add_flag(name, description);
            help_ptr_->configurable(false);
        }

        return help_ptr_;
    }